

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Copy
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  int iVar7;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar8;
  undefined4 in_stack_ffffffffffffff64;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  uint32_t *in_stack_ffffffffffffffb8;
  uint32_t *in_stack_ffffffffffffffc0;
  
  iVar7 = in_stack_00000008;
  iVar8 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff90,(uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8
            );
  bVar1 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff64,iVar8),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff5c,iVar7));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x154bf4);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar4 = puVar4 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar2);
  puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar5 = puVar5 + (ulong)(in_R8D * (uint)bVar1) + (ulong)(in_R9D * uVar3);
  puVar6 = puVar5 + in_stack_00000010 * uVar3;
  for (; puVar5 != puVar6; puVar5 = puVar5 + uVar3) {
    memcpy(puVar5,puVar4,(ulong)(in_stack_00000008 * (uint)bVar1));
    puVar4 = puVar4 + uVar2;
  }
  return;
}

Assistant:

void Copy( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn )
            memcpy( outY, inY, sizeof( uint8_t ) * width );
    }